

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-util.cc
# Opt level: O0

bool tinyusdz::io::SplitUDIMPath(string *path,string *pre,string *post)

{
  bool bVar1;
  allocator<char> local_121;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  string local_110 [39];
  allocator<char> local_e9;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  string local_d8 [32];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  char *local_b0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  re;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  char *local_78;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  rs;
  string local_48 [8];
  string tag;
  string *post_local;
  string *pre_local;
  string *path_local;
  
  tag.field_2._8_8_ = post;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_48,"<UDIM>",(allocator *)((long)&rs._M_current + 7));
  ::std::allocator<char>::~allocator((allocator<char> *)((long)&rs._M_current + 7));
  local_60._M_current = (char *)::std::__cxx11::string::begin();
  local_68._M_current = (char *)::std::__cxx11::string::end();
  local_70._M_current = (char *)::std::__cxx11::string::begin();
  local_78 = (char *)::std::__cxx11::string::end();
  local_58 = ::std::
             search<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                       (local_60,local_68,local_70,
                        (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )local_78);
  local_80._M_current = (char *)::std::__cxx11::string::end();
  bVar1 = __gnu_cxx::operator==(&local_58,&local_80);
  if (bVar1) {
    path_local._7_1_ = false;
  }
  else {
    local_98._M_current = (char *)::std::__cxx11::string::begin();
    local_a0._M_current = (char *)::std::__cxx11::string::end();
    local_a8._M_current = (char *)::std::__cxx11::string::begin();
    local_b0 = (char *)::std::__cxx11::string::end();
    local_90 = ::std::
               find_end<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                         (local_98,local_a0,local_a8,
                          (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           )local_b0);
    local_b8._M_current = (char *)::std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator==(&local_90,&local_b8);
    if (bVar1) {
      path_local._7_1_ = false;
    }
    else {
      bVar1 = __gnu_cxx::operator!=(&local_58,&local_90);
      if (bVar1) {
        path_local._7_1_ = false;
      }
      else {
        if (pre != (string *)0x0) {
          local_e0._M_current = (char *)::std::__cxx11::string::begin();
          local_e8._M_current = local_58._M_current;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::
          string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                    (local_d8,local_e0,local_e8,&local_e9);
          ::std::__cxx11::string::operator=((string *)pre,local_d8);
          ::std::__cxx11::string::~string(local_d8);
          ::std::allocator<char>::~allocator(&local_e9);
        }
        if (tag.field_2._8_8_ != 0) {
          local_118._M_current = local_90._M_current;
          local_120._M_current = (char *)::std::__cxx11::string::end();
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::
          string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                    (local_110,local_118,local_120,&local_121);
          ::std::__cxx11::string::operator=((string *)tag.field_2._8_8_,local_110);
          ::std::__cxx11::string::~string(local_110);
          ::std::allocator<char>::~allocator(&local_121);
        }
        path_local._7_1_ = true;
      }
    }
  }
  re._M_current._4_4_ = 1;
  ::std::__cxx11::string::~string(local_48);
  return path_local._7_1_;
}

Assistant:

bool SplitUDIMPath(const std::string &path, std::string *pre,
                   std::string *post) {
  std::string tag = "<UDIM>";

  auto rs = std::search(path.begin(), path.end(), tag.begin(), tag.end());
  if (rs == path.end()) {
    return false;
  }

  auto re = std::find_end(path.begin(), path.end(), tag.begin(), tag.end());
  if (re == path.end()) {
    return false;
  }

  // No multiple tags. e.g. diffuse.<UDIM>.<UDIM>.png
  if (rs != re) {
    return false;
  }

  if (pre) {
    (*pre) = std::string(path.begin(), rs);
  }

  if (post) {
    (*post) = std::string(re, path.end());
  }

  return true;
}